

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfcn.c
# Opt level: O1

ssize_t mpt_memrfcn(iovec *data,size_t ndat,_func_int_int_void_ptr *fcn,void *par)

{
  void *pvVar1;
  int iVar2;
  size_t *psVar3;
  int *piVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  size_t local_38;
  
  if (fcn == (_func_int_int_void_ptr *)0x0 || data == (iovec *)0x0) {
    local_38 = 0xffffffffffffffff;
    iVar2 = 0xe;
LAB_00114b24:
    piVar4 = __errno_location();
    *piVar4 = iVar2;
  }
  else {
    do {
      bVar8 = ndat == 0;
      ndat = ndat - 1;
      if (bVar8) {
        local_38 = 0xfffffffffffffffe;
        iVar2 = 0xb;
        goto LAB_00114b24;
      }
      pvVar1 = data[ndat].iov_base;
      sVar7 = data[ndat].iov_len;
      do {
        sVar6 = sVar7;
        sVar7 = sVar6 - 1;
        if (sVar6 == 0) goto LAB_00114af9;
        iVar2 = (*fcn)((int)*(undefined1 *)((long)pvVar1 + (sVar6 - 1)),par);
      } while (iVar2 == 0);
      local_38 = sVar7;
      if (ndat != 0) {
        uVar5 = 0;
        psVar3 = &data->iov_len;
        do {
          local_38 = local_38 + *psVar3;
          if ((long)local_38 < 0) {
            piVar4 = __errno_location();
            *piVar4 = 0x4b;
            local_38 = 0xffffffffffffffff;
            break;
          }
          uVar5 = uVar5 + 1;
          psVar3 = psVar3 + 2;
        } while (uVar5 < ndat);
      }
LAB_00114af9:
    } while (sVar6 == 0);
  }
  return local_38;
}

Assistant:

extern ssize_t mpt_memrfcn(const struct iovec *data, size_t ndat, int (*fcn)(int , void *), void *par)
{
	size_t i = ndat;
	
	if (!data || !fcn) {
		errno = EFAULT; return -1;
	}
	
	while (i--) {
		unsigned char *tmp = data[i].iov_base;
		size_t pos = data[i].iov_len;
		
		while (pos--) {
			if (fcn(tmp[pos], par)) {
				for (ndat = 0; ndat < i; ++ndat) {
					if ((pos += data[ndat].iov_len) > SSIZE_MAX) {
						errno = EOVERFLOW;
						return -1;
					}
				}
				return pos;
			}
		}
	}
	
	errno = EAGAIN;
	
	return -2;
}